

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O3

void __thiscall AVSInterface::AVSWrapper<MiniDeen>::Initialize(AVSWrapper<MiniDeen> *this)

{
  PClip *pPVar1;
  undefined8 uVar2;
  anon_union_8_9_d3d94a0b_for_AVSValue_2 aVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  char cVar6;
  int iVar7;
  long lVar8;
  long *plVar9;
  undefined4 extraout_var;
  AVSFetchFrameFunctor *pAVar11;
  undefined4 extraout_var_00;
  code *pcVar12;
  ulong uVar13;
  undefined8 *puVar14;
  AVSValue *pAVar15;
  ulong uVar16;
  undefined1 uVar17;
  byte bVar18;
  initializer_list<Param> __l;
  AVSInDelegator argument;
  DSVideoInfo in_stack_fffffffffffffd48;
  undefined2 local_25c;
  undefined1 local_25a;
  allocator_type local_259;
  IScriptEnvironment *local_258;
  PClip local_250;
  anon_union_8_9_d3d94a0b_for_AVSValue_2 local_248;
  undefined8 uStack_240;
  IClip *local_238;
  undefined8 uStack_230;
  undefined1 local_228 [16];
  undefined8 local_218;
  undefined8 uStack_210;
  undefined4 local_208;
  undefined4 uStack_1f8;
  undefined4 local_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  AVSValue *local_1d8;
  vector<Param,_std::allocator<Param>_> local_1d0;
  AVSValue local_1b8;
  AVSInDelegator local_1a8;
  undefined1 local_158 [16];
  int iStack_148;
  int iStack_144;
  int iStack_140;
  undefined4 uStack_13c;
  ulong local_138;
  ulong uStack_130;
  undefined8 local_128;
  undefined4 local_120;
  undefined8 local_11c;
  undefined4 uStack_114;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_88 [2];
  anon_union_8_9_d3d94a0b_for_AVSValue_2 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  ulong local_68;
  ulong local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined4 local_34;
  undefined8 *puVar10;
  
  bVar18 = 0;
  local_218 = 0;
  uStack_210 = 0;
  local_208 = 0;
  local_1f4 = 0;
  uStack_1f0 = 0;
  uStack_1ec = 0;
  uStack_1e8 = 0;
  if (AVS_linkage == (AVS_Linkage *)0x0) {
LAB_0010deef:
    local_228 = ZEXT416(3);
    local_238 = (IClip *)0x1000001;
    uStack_230 = 0;
    local_248.clip = (IClip *)0x0;
    uStack_240 = 0x100000008;
    uVar16 = 1;
    uVar17 = 0;
    uVar13 = 1;
  }
  else {
    pAVar15 = &this->_args;
    if ((uint)AVS_linkage->Size < 0x509) {
LAB_0010de82:
      local_228 = ZEXT416(3);
      local_238 = (IClip *)0x1000001;
      uStack_230 = 0;
      local_248.clip = (IClip *)0x0;
      uStack_240 = 0x100000008;
      uVar16 = 1;
      uVar17 = 0;
      uVar13 = 1;
    }
    else {
      pcVar12 = (code *)AVS_linkage->AVSValue_OPERATOR_INDEX;
      plVar9 = (long *)((long)&pAVar15->type + *(long *)&AVS_linkage->field_0x510);
      if (((ulong)pcVar12 & 1) != 0) {
        pcVar12 = *(code **)(pcVar12 + *plVar9 + -1);
      }
      lVar8 = (*pcVar12)(plVar9,0);
      if (AVS_linkage == (AVS_Linkage *)0x0) goto LAB_0010deef;
      if ((uint)AVS_linkage->Size < 0x529) goto LAB_0010de82;
      pcVar12 = (code *)AVS_linkage->IsClip;
      plVar9 = (long *)(lVar8 + *(long *)&AVS_linkage->field_0x530);
      if (((ulong)pcVar12 & 1) != 0) {
        pcVar12 = *(code **)(pcVar12 + *plVar9 + -1);
      }
      cVar6 = (*pcVar12)(plVar9);
      if (cVar6 == '\0') {
        local_228 = ZEXT416(3);
        local_238 = (IClip *)0x1000001;
        uStack_230 = 0;
        local_248.clip = (IClip *)0x0;
        uStack_240 = 0x100000008;
        uVar13 = 1;
        uVar17 = 0;
        uVar16 = 1;
      }
      else {
        if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x508 < (uint)AVS_linkage->Size)) {
          pcVar12 = (code *)AVS_linkage->AVSValue_OPERATOR_INDEX;
          plVar9 = (long *)((long)&pAVar15->type + *(long *)&AVS_linkage->field_0x510);
          if (((ulong)pcVar12 & 1) != 0) {
            pcVar12 = *(code **)(pcVar12 + *plVar9 + -1);
          }
          (*pcVar12)(plVar9,0);
        }
        AVSValue::AsClip((AVSValue *)local_158);
        pPVar1 = &this->clip;
        if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x3c8 < (uint)AVS_linkage->Size)) {
          pcVar12 = (code *)AVS_linkage->PClip_OPERATOR_ASSIGN1;
          plVar9 = (long *)((long)&pPVar1->p + *(long *)&AVS_linkage->field_0x3d0);
          if (((ulong)pcVar12 & 1) != 0) {
            pcVar12 = *(code **)(pcVar12 + *plVar9 + -1);
          }
          (*pcVar12)(plVar9,local_158);
        }
        local_1d8 = pAVar15;
        PClip::~PClip((PClip *)local_158);
        local_258 = (IScriptEnvironment *)pPVar1;
        iVar7 = (*pPVar1->p->_vptr_IClip[5])();
        puVar10 = (undefined8 *)CONCAT44(extraout_var,iVar7);
        uVar16 = (ulong)*(uint *)(puVar10 + 1);
        uVar13 = (ulong)*(uint *)((long)puVar10 + 0xc);
        local_228._0_4_ = *(undefined4 *)(puVar10 + 2);
        local_238 = (IClip *)puVar10[4];
        uStack_230 = puVar10[5];
        uVar2 = *puVar10;
        local_248 = (anon_union_8_9_d3d94a0b_for_AVSValue_2)puVar10[3];
        DSFormat::DSFormat((DSFormat *)local_158,*(int *)((long)puVar10 + 0x14));
        aVar3 = local_248;
        uVar4 = local_228._0_4_;
        local_120 = local_228._0_4_;
        local_11c = local_248;
        uVar5 = local_11c;
        local_110 = SUB84(local_238,0);
        uStack_10c = (undefined4)((ulong)local_238 >> 0x20);
        uStack_108 = (undefined4)uStack_230;
        uStack_104 = (undefined4)((ulong)uStack_230 >> 0x20);
        local_238 = (IClip *)local_158._0_8_;
        uStack_230 = 0;
        uVar17 = local_158[4];
        local_25c = local_158._5_2_;
        local_25a = local_158[7];
        uStack_240 = CONCAT44(iStack_144,iStack_148);
        local_248 = (anon_union_8_9_d3d94a0b_for_AVSValue_2)local_158._8_8_;
        local_228._4_4_ = uStack_13c;
        local_228._0_4_ = iStack_140;
        local_228._8_8_ = 0;
        local_11c._0_4_ = aVar3._0_4_;
        uStack_210 = CONCAT44((undefined4)local_11c,uVar4);
        local_11c._4_4_ = aVar3._4_4_;
        local_208 = local_11c._4_4_;
        uStack_1e8 = uStack_104;
        uStack_1f8 = uStack_114;
        local_1f4 = local_110;
        uStack_1f0 = uStack_10c;
        uStack_1ec = uStack_108;
        local_218 = uVar2;
        local_138 = uVar16;
        uStack_130 = uVar13;
        local_128 = uVar2;
        local_11c = uVar5;
        pAVar11 = (AVSFetchFrameFunctor *)operator_new(0x70);
        if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x398 < (uint)AVS_linkage->Size)) {
          pcVar12 = (code *)AVS_linkage->PClip_CONSTRUCTOR1;
          plVar9 = (long *)((long)&local_250.p + *(long *)&AVS_linkage->field_0x3a0);
          if (((ulong)pcVar12 & 1) != 0) {
            pcVar12 = *(code **)(pcVar12 + *plVar9 + -1);
          }
          (*pcVar12)(plVar9,local_258);
        }
        iVar7 = (*(*(IClip **)&local_258->field_0x0)->_vptr_IClip[5])();
        puVar10 = (undefined8 *)CONCAT44(extraout_var_00,iVar7);
        local_158._0_8_ = *puVar10;
        local_158._8_8_ = *(anon_union_8_9_d3d94a0b_for_AVSValue_2 *)(puVar10 + 1);
        iStack_148 = *(int *)(puVar10 + 2);
        iStack_144 = *(int *)((long)puVar10 + 0x14);
        iStack_140 = *(int *)(puVar10 + 3);
        uStack_13c = *(undefined4 *)((long)puVar10 + 0x1c);
        local_138 = puVar10[4];
        uStack_130 = puVar10[5];
        local_258 = this->_env;
        (pAVar11->super_FetchFrameFunctor)._vptr_FetchFrameFunctor =
             (_func_int **)&PTR_operator___00116b40;
        if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x398 < (uint)AVS_linkage->Size)) {
          pcVar12 = (code *)AVS_linkage->PClip_CONSTRUCTOR1;
          plVar9 = (long *)((long)&(pAVar11->_clip).p + *(long *)&AVS_linkage->field_0x3a0);
          if (((ulong)pcVar12 & 1) != 0) {
            pcVar12 = *(code **)(pcVar12 + *plVar9 + -1);
          }
          (*pcVar12)(plVar9,&local_250);
        }
        (pAVar11->_vi).num_audio_samples = local_138;
        (pAVar11->_vi).nchannels = (undefined4)uStack_130;
        (pAVar11->_vi).image_type = uStack_130._4_4_;
        (pAVar11->_vi).num_frames = iStack_148;
        (pAVar11->_vi).pixel_type = iStack_144;
        (pAVar11->_vi).audio_samples_per_second = iStack_140;
        (pAVar11->_vi).sample_type = uStack_13c;
        (pAVar11->_vi).width = local_158._0_4_;
        (pAVar11->_vi).height = local_158._4_4_;
        (pAVar11->_vi).fps_numerator = local_158._8_4_;
        (pAVar11->_vi).fps_denominator = local_158._12_4_;
        pAVar11->_env = local_258;
        (pAVar11->fetch_frame_mutex).super___mutex_base._M_mutex.__align = 0;
        *(undefined8 *)((long)&(pAVar11->fetch_frame_mutex).super___mutex_base._M_mutex + 8) = 0;
        *(undefined8 *)((long)&(pAVar11->fetch_frame_mutex).super___mutex_base._M_mutex + 0x10) = 0;
        (pAVar11->fetch_frame_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
             (__pthread_internal_list *)0x0;
        (pAVar11->fetch_frame_mutex).super___mutex_base._M_mutex.__data.__list.__next =
             (__pthread_internal_list *)0x0;
        this->functor = pAVar11;
        PClip::~PClip(&local_250);
        pAVar15 = local_1d8;
      }
      if (AVS_linkage == (AVS_Linkage *)0x0) goto LAB_0010df2b;
    }
    if (0x4d8 < (uint)AVS_linkage->Size) {
      pcVar12 = (code *)AVS_linkage->AVSValue_CONSTRUCTOR9;
      plVar9 = (long *)((long)&local_1b8.type + *(long *)&AVS_linkage->field_0x4e0);
      if (((ulong)pcVar12 & 1) != 0) {
        pcVar12 = *(code **)(pcVar12 + *plVar9 + -1);
      }
      (*pcVar12)(plVar9,pAVar15);
    }
  }
LAB_0010df2b:
  memcpy((iterator)local_158,&PTR_anon_var_dwarf_3a09_001168e8,0xd0);
  __l._M_len = 0xd;
  __l._M_array = (iterator)local_158;
  std::vector<Param,_std::allocator<Param>_>::vector(&local_1d0,__l,&local_259);
  AVSInDelegator::AVSInDelegator(&local_1a8,&local_1b8,&local_1d0);
  if (local_1d0.super__Vector_base<Param,_std::allocator<Param>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1d0.super__Vector_base<Param,_std::allocator<Param>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d0.super__Vector_base<Param,_std::allocator<Param>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.super__Vector_base<Param,_std::allocator<Param>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  AVSValue::~AVSValue(&local_1b8);
  local_88[0] = local_238._0_4_;
  local_88[1]._0_1_ = uVar17;
  local_88[1]._1_2_ = local_25c;
  local_88[1]._3_1_ = local_25a;
  local_80 = local_248;
  uStack_78 = uStack_240;
  local_70 = local_228._0_8_;
  local_68 = uVar16;
  local_60 = uVar13;
  local_58 = local_218;
  uStack_50 = uStack_210;
  local_48 = local_208;
  local_44 = CONCAT44(local_1f4,uStack_1f8);
  uStack_3c = CONCAT44(uStack_1ec,uStack_1f0);
  local_34 = uStack_1e8;
  pAVar11 = this->functor;
  puVar10 = (undefined8 *)local_88;
  puVar14 = (undefined8 *)&stack0xfffffffffffffd48;
  for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar14 = *puVar10;
    puVar10 = puVar10 + (ulong)bVar18 * -2 + 1;
    puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
  }
  MiniDeen::Initialize
            (&this->data,&local_1a8.super_InDelegator,in_stack_fffffffffffffd48,
             &pAVar11->super_FetchFrameFunctor);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1a8._params_index_map._M_h);
  AVSValue::~AVSValue(&local_1a8._args);
  return;
}

Assistant:

void Initialize()
    {
      auto input_vi = DSVideoInfo();
      if (_args[0].IsClip()) {
        clip = _args[0].AsClip();
        input_vi = DSVideoInfo(clip->GetVideoInfo());
        functor = new AVSFetchFrameFunctor(clip, clip->GetVideoInfo(), _env);
      }
      auto argument = AVSInDelegator(_args, data.Params());
      data.Initialize(&argument, input_vi, functor);
    }